

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenEnumOffsetAlias
          (KotlinKMPGenerator *this,EnumDef *enum_def,CodeWriter *writer)

{
  string local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  CodeWriter *local_20;
  CodeWriter *writer_local;
  EnumDef *enum_def_local;
  KotlinKMPGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    local_20 = writer;
    writer_local = (CodeWriter *)enum_def;
    enum_def_local = (EnumDef *)this;
    IdlNamer::Type_abi_cxx11_(&local_c0,&this->namer_,enum_def);
    std::operator+(&local_a0,"typealias ",&local_c0);
    std::operator+(&local_80,&local_a0,"Array = ");
    GenTypeBasic_abi_cxx11_(&local_f0,this,(BaseType *)&writer_local->field_0xd0);
    std::operator+(&local_60,&local_80,&local_f0);
    std::operator+(&local_40,&local_60,"Array");
    CodeWriter::operator+=(local_20,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void GenEnumOffsetAlias(EnumDef &enum_def, CodeWriter &writer) const {
    if (enum_def.generated) return;
    // This assumes offset as Ints always.
    writer += "typealias " + namer_.Type(enum_def) +
              "Array = " + GenTypeBasic(enum_def.underlying_type.base_type) +
              "Array";
  }